

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Clipper::ProcessIntersections(Clipper *this,cInt topY)

{
  bool bVar1;
  long lVar2;
  
  if (*(long *)(this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != 0
     ) {
    BuildIntersectList(this,topY);
    lVar2 = (long)(this->m_IntersectList).
                  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_IntersectList).
                  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (lVar2 != 0) {
      if ((lVar2 != 1) && (bVar1 = FixupIntersectionOrder(this), !bVar1)) {
        return false;
      }
      ProcessIntersectList(this);
      this->m_SortedEdges = (TEdge *)0x0;
    }
  }
  return true;
}

Assistant:

bool Clipper::ProcessIntersections(const cInt topY)
{
  if( !m_ActiveEdges ) return true;
  try {
    BuildIntersectList(topY);
    size_t IlSize = m_IntersectList.size();
    if (IlSize == 0) return true;
    if (IlSize == 1 || FixupIntersectionOrder()) ProcessIntersectList();
    else return false;
  }
  catch(...) 
  {
    m_SortedEdges = 0;
    DisposeIntersectNodes();
    throw clipperException("ProcessIntersections error");
  }
  m_SortedEdges = 0;
  return true;
}